

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

unsigned_long __thiscall internalJSONNode::operator_cast_to_unsigned_long(internalJSONNode *this)

{
  double dVar1;
  uchar uVar2;
  json_string *pjVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  internalJSONNode *local_18;
  internalJSONNode *this_local;
  
  local_18 = this;
  Fetch(this);
  uVar2 = type(this);
  if (uVar2 == '\0') {
    this_local = (internalJSONNode *)0x0;
  }
  else {
    if (uVar2 == '\x01') {
      FetchNumber(this);
    }
    else if (uVar2 == '\x03') {
      return (long)(int)(uint)(((this->_value)._bool & 1U) != 0);
    }
    uVar2 = type(this);
    pjVar3 = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&local_38,pjVar3,"(unsigned long)");
    JSONDebug::_JSON_ASSERT(uVar2 == '\x02',&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    dVar1 = (this->_value)._number;
    pjVar3 = jsonSingletonERROR_LOWER_RANGE::getValue_abi_cxx11_();
    std::operator+(&local_88,&this->_string,pjVar3);
    std::operator+(&local_68,&local_88,"unsigned long");
    JSONDebug::_JSON_ASSERT(0.0 < dVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    dVar1 = (this->_value)._number;
    pjVar3 = jsonSingletonERROR_UPPER_RANGE::getValue_abi_cxx11_();
    std::operator+(&local_c8,&this->_string,pjVar3);
    std::operator+(&local_a8,&local_c8,"unsigned long");
    JSONDebug::_JSON_ASSERT(dVar1 < 1.8446744073709552e+19,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    dVar1 = (this->_value)._number;
    uVar4 = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
    auVar5._8_4_ = (int)(uVar4 >> 0x20);
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = 0x45300000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"(unsigend long) will truncate ",&local_109);
    std::operator+(&local_e8,&local_108,&this->_string);
    JSONDebug::_JSON_ASSERT
              ((bool)(-((auVar5._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0) == dVar1) & 1
                     ),&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    uVar4 = (ulong)(this->_value)._number;
    this_local = (internalJSONNode *)
                 (uVar4 | (long)((this->_value)._number - 9.223372036854776e+18) &
                          (long)uVar4 >> 0x3f);
  }
  return (unsigned_long)this_local;
}

Assistant:

internalJSONNode::operator unsigned long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number < ULONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long"));
		  JSON_ASSERT(_value._number == (json_number)((unsigned long)_value._number), json_string(JSON_TEXT("(unsigend long) will truncate ")) + _string);
		  return (unsigned long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(unsigned long long)"));
		  JSON_ASSERT(_value._number > 0, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("unsigned long long"));
		  #ifdef ULONG_LONG_MAX
			 JSON_ASSERT(_value._number < ULONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #elif defined(ULLONG_MAX)
			 JSON_ASSERT(_value._number < ULLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("unsigned long long"));
		  #endif
		  JSON_ASSERT(_value._number == (json_number)((unsigned long long)_value._number), json_string(JSON_TEXT("(unsigned long long) will truncate ")) + _string);
		  return (unsigned long long)_value._number;
	   #endif /*<- */
    }